

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void RD4_SSE2(uint8_t *dst,uint8_t *top)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  unkbyte9 Var3;
  unkbyte9 Var4;
  ulong *puVar5;
  long in_RSI;
  uint8_t *in_RDI;
  undefined1 uVar6;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined1 uVar21;
  undefined1 uVar22;
  undefined1 auVar7 [16];
  __m128i abcdefg;
  __m128i avg2;
  __m128i lsb;
  __m128i avg1;
  __m128i JIXABCD__;
  __m128i KJIXABCD_;
  __m128i LKJIXABCD;
  __m128i LKJIXABC;
  __m128i one;
  ulong local_1d8;
  uint32_t local_138;
  undefined1 local_a8;
  undefined1 uStack_a7;
  undefined1 uStack_a6;
  undefined1 uStack_a5;
  undefined1 uStack_a4;
  undefined1 uStack_a3;
  undefined1 uStack_a2;
  undefined1 uStack_a1;
  undefined1 local_98;
  undefined1 uStack_97;
  undefined1 uStack_96;
  undefined1 uStack_95;
  undefined1 uStack_94;
  undefined1 uStack_93;
  undefined1 uStack_92;
  undefined1 uStack_91;
  undefined1 uStack_90;
  undefined1 uStack_8f;
  undefined1 uStack_8e;
  undefined1 uStack_8d;
  undefined1 uStack_8c;
  undefined1 uStack_8b;
  undefined1 uStack_8a;
  undefined1 uStack_89;
  undefined1 local_88;
  undefined1 uStack_87;
  undefined1 uStack_86;
  undefined1 uStack_85;
  undefined1 uStack_84;
  undefined1 uStack_83;
  undefined1 uStack_82;
  undefined1 uStack_81;
  undefined1 local_78;
  undefined1 uStack_77;
  undefined1 uStack_76;
  undefined1 uStack_75;
  undefined1 uStack_74;
  undefined1 uStack_73;
  undefined1 uStack_72;
  
  puVar5 = (ulong *)(in_RSI + -5);
  uVar1 = *puVar5;
  Var4 = *(unkbyte9 *)puVar5;
  Var3 = *(unkbyte9 *)puVar5;
  local_1d8 = (ulong)((unkuint9)Var4 >> 0x10);
  local_78 = (undefined1)((unkuint9)Var4 >> 0x10);
  uStack_77 = (undefined1)((unkuint9)Var4 >> 0x18);
  uStack_76 = (undefined1)((unkuint9)Var4 >> 0x20);
  uStack_75 = (undefined1)((unkuint9)Var4 >> 0x28);
  uStack_74 = (undefined1)((unkuint9)Var4 >> 0x30);
  uStack_73 = (undefined1)((unkuint9)Var4 >> 0x38);
  uStack_72 = (undefined1)((unkuint9)Var4 >> 0x40);
  local_88 = (undefined1)uVar1;
  uStack_87 = (undefined1)(uVar1 >> 8);
  uStack_86 = (undefined1)(uVar1 >> 0x10);
  uStack_85 = (undefined1)(uVar1 >> 0x18);
  uStack_84 = (undefined1)(uVar1 >> 0x20);
  uStack_83 = (undefined1)(uVar1 >> 0x28);
  uStack_82 = (undefined1)(uVar1 >> 0x30);
  uStack_81 = (undefined1)(uVar1 >> 0x38);
  uVar6 = pavgb(local_78,local_88);
  uVar8 = pavgb(uStack_77,uStack_87);
  uVar9 = pavgb(uStack_76,uStack_86);
  uVar10 = pavgb(uStack_75,uStack_85);
  uVar11 = pavgb(uStack_74,uStack_84);
  uVar12 = pavgb(uStack_73,uStack_83);
  uVar13 = pavgb(uStack_72,uStack_82);
  uVar14 = pavgb(0,uStack_81);
  uVar15 = pavgb(0,*(byte *)(in_RSI + 3));
  uVar16 = pavgb(0,0);
  uVar17 = pavgb(0,0);
  uVar18 = pavgb(0,0);
  uVar19 = pavgb(0,0);
  uVar20 = pavgb(0,0);
  uVar21 = pavgb(0,0);
  uVar22 = pavgb(0,0);
  auVar2[1] = uVar8;
  auVar2[0] = uVar6;
  auVar2[2] = uVar9;
  auVar2[3] = uVar10;
  auVar2[4] = uVar11;
  auVar2[5] = uVar12;
  auVar2[6] = uVar13;
  auVar2[7] = uVar14;
  auVar2[9] = uVar16;
  auVar2[8] = uVar15;
  auVar2[10] = uVar17;
  auVar2[0xb] = uVar18;
  auVar2[0xc] = uVar19;
  auVar2[0xd] = uVar20;
  auVar2[0xe] = uVar21;
  auVar2[0xf] = uVar22;
  auVar7._8_8_ = (ulong)*(byte *)(in_RSI + 3) & 0x1010101010101;
  auVar7._0_8_ = (local_1d8 ^ uVar1) & 0x101010101010101;
  auVar7 = psubusb(auVar2,auVar7);
  local_98 = auVar7[0];
  uStack_97 = auVar7[1];
  uStack_96 = auVar7[2];
  uStack_95 = auVar7[3];
  uStack_94 = auVar7[4];
  uStack_93 = auVar7[5];
  uStack_92 = auVar7[6];
  uStack_91 = auVar7[7];
  uStack_90 = auVar7[8];
  uStack_8f = auVar7[9];
  uStack_8e = auVar7[10];
  uStack_8d = auVar7[0xb];
  uStack_8c = auVar7[0xc];
  uStack_8b = auVar7[0xd];
  uStack_8a = auVar7[0xe];
  uStack_89 = auVar7[0xf];
  local_a8 = (undefined1)((unkuint9)Var3 >> 8);
  uStack_a7 = (undefined1)((unkuint9)Var3 >> 0x10);
  uStack_a6 = (undefined1)((unkuint9)Var3 >> 0x18);
  uStack_a5 = (undefined1)((unkuint9)Var3 >> 0x20);
  uStack_a4 = (undefined1)((unkuint9)Var3 >> 0x28);
  uStack_a3 = (undefined1)((unkuint9)Var3 >> 0x30);
  uStack_a2 = (undefined1)((unkuint9)Var3 >> 0x38);
  uStack_a1 = (undefined1)((unkuint9)Var3 >> 0x40);
  uVar6 = pavgb(local_98,local_a8);
  uVar8 = pavgb(uStack_97,uStack_a7);
  uVar9 = pavgb(uStack_96,uStack_a6);
  uVar10 = pavgb(uStack_95,uStack_a5);
  uVar11 = pavgb(uStack_94,uStack_a4);
  uVar12 = pavgb(uStack_93,uStack_a3);
  uVar13 = pavgb(uStack_92,uStack_a2);
  pavgb(uStack_91,uStack_a1);
  pavgb(uStack_90,0);
  pavgb(uStack_8f,0);
  pavgb(uStack_8e,0);
  pavgb(uStack_8d,0);
  pavgb(uStack_8c,0);
  pavgb(uStack_8b,0);
  pavgb(uStack_8a,0);
  pavgb(uStack_89,0);
  WebPUint32ToMem(in_RDI + 0x60,CONCAT13(uVar10,CONCAT12(uVar9,CONCAT11(uVar8,uVar6))));
  local_138 = (uint32_t)
              (CONCAT14(uVar11,CONCAT13(uVar10,CONCAT12(uVar9,CONCAT11(uVar8,uVar6)))) >> 8);
  WebPUint32ToMem(in_RDI + 0x40,local_138);
  WebPUint32ToMem(in_RDI + 0x20,CONCAT13(uVar12,CONCAT12(uVar11,CONCAT11(uVar10,uVar9))));
  WebPUint32ToMem(in_RDI,CONCAT13(uVar13,CONCAT12(uVar12,CONCAT11(uVar11,uVar10))));
  return;
}

Assistant:

static void RD4_SSE2(uint8_t* dst) {   // Down-right
  const __m128i one = _mm_set1_epi8(1);
  const __m128i XABCD = _mm_loadl_epi64((__m128i*)(dst - BPS - 1));
  const __m128i ____XABCD = _mm_slli_si128(XABCD, 4);
  const uint32_t I = dst[-1 + 0 * BPS];
  const uint32_t J = dst[-1 + 1 * BPS];
  const uint32_t K = dst[-1 + 2 * BPS];
  const uint32_t L = dst[-1 + 3 * BPS];
  const __m128i LKJI_____ =
      _mm_cvtsi32_si128(L | (K << 8) | (J << 16) | (I << 24));
  const __m128i LKJIXABCD = _mm_or_si128(LKJI_____, ____XABCD);
  const __m128i KJIXABCD_ = _mm_srli_si128(LKJIXABCD, 1);
  const __m128i JIXABCD__ = _mm_srli_si128(LKJIXABCD, 2);
  const __m128i avg1 = _mm_avg_epu8(JIXABCD__, LKJIXABCD);
  const __m128i lsb = _mm_and_si128(_mm_xor_si128(JIXABCD__, LKJIXABCD), one);
  const __m128i avg2 = _mm_subs_epu8(avg1, lsb);
  const __m128i abcdefg = _mm_avg_epu8(avg2, KJIXABCD_);
  WebPUint32ToMem(dst + 3 * BPS, _mm_cvtsi128_si32(               abcdefg    ));
  WebPUint32ToMem(dst + 2 * BPS, _mm_cvtsi128_si32(_mm_srli_si128(abcdefg, 1)));
  WebPUint32ToMem(dst + 1 * BPS, _mm_cvtsi128_si32(_mm_srli_si128(abcdefg, 2)));
  WebPUint32ToMem(dst + 0 * BPS, _mm_cvtsi128_si32(_mm_srli_si128(abcdefg, 3)));
}